

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcRailing::IfcRailing(IfcRailing *this)

{
  *(undefined ***)&this->field_0x180 = &PTR__Object_00836880;
  *(undefined8 *)&this->field_0x188 = 0;
  *(char **)&this->field_0x190 = "IfcRailing";
  IfcBuildingElement::IfcBuildingElement
            ((IfcBuildingElement *)this,&PTR_construction_vtable_24__008824e8);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailing,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x8823b8;
  *(undefined8 *)&this->field_0x180 = 0x8824d0;
  *(undefined8 *)&this->field_0x88 = 0x8823e0;
  *(undefined8 *)&this->field_0x98 = 0x882408;
  *(undefined8 *)&this->field_0xd0 = 0x882430;
  *(undefined8 *)&this->field_0x100 = 0x882458;
  *(undefined8 *)&this->field_0x138 = 0x882480;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailing,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x8824a8;
  *(undefined1 **)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailing,_1UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailing,_1UL>).field_0x20;
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailing,_1UL>).field_0x18 =
       0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailing,_1UL>).field_0x20 = 0;
  this->field_0x178 = 0;
  return;
}

Assistant:

IfcRailing() : Object("IfcRailing") {}